

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O2

unique_ptr<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
cmList::TransformSelector::NewAT(initializer_list<long> indexes)

{
  long in_RDX;
  allocator_type local_31;
  undefined1 local_30 [8];
  _Vector_base<long,_std::allocator<long>_> local_28;
  
  std::vector<long,std::allocator<long>>::vector<long_const*,void>
            ((vector<long,std::allocator<long>> *)&local_28,(long *)indexes._M_len,
             (long *)indexes._M_len + in_RDX,&local_31);
  std::
  make_unique<(anonymous_namespace)::TransformSelectorAt,std::vector<long,std::allocator<long>>>
            ((vector<long,_std::allocator<long>_> *)local_30);
  *indexes._M_array = (long)local_30;
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_28);
  return (__uniq_ptr_data<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>,_true,_true>
          )(tuple<cmList::TransformSelector_*,_std::default_delete<cmList::TransformSelector>_>)
           indexes._M_array;
}

Assistant:

std::unique_ptr<cmList::TransformSelector> cmList::TransformSelector::NewAT(
  std::initializer_list<index_type> indexes)
{
  return cm::make_unique<TransformSelectorAt>(
    std::vector<index_type>{ indexes.begin(), indexes.end() });
  ;
}